

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.cpp
# Opt level: O0

bool generate_event(void)

{
  FILE *__stream;
  FILE *fp;
  
  __stream = fopen("/sys/bus/iio/devices/iio_evgen/poke_ev0","w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"1\n");
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool
generate_event()
{
    FILE* fp = fopen("/sys/bus/iio/devices/iio_evgen/poke_ev0", "w");
    if (fp == NULL)
        return false;
    fprintf(fp, "1\n");
    fclose(fp);
    return true;
}